

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O0

string * license::remove_extension(string *__return_storage_ptr__,string *path)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  size_t pathsep_pos;
  size_t dotpos;
  string *path_local;
  
  bVar1 = std::operator==(path,".");
  if ((bVar1) || (bVar1 = std::operator==(path,".."), bVar1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  }
  else {
    lVar2 = std::__cxx11::string::find_last_of((char *)path,0x1bf53f);
    if (lVar2 == -1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
    }
    else {
      uVar3 = std::__cxx11::string::find_last_of((char *)path,0x1bc356);
      if (uVar3 == 0xffffffffffffffff) {
        if (lVar2 == 0) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
        }
        else {
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
        }
      }
      else if (uVar3 < lVar2 + 1U) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string remove_extension(const string& path) {
	if (path == "." || path == "..") {
		return path;
	}
	size_t dotpos = path.find_last_of(".");
	//no dot
	if (dotpos == string::npos) {
		return path;
	}
	//find the last path separator
	size_t pathsep_pos = path.find_last_of("\\/");
	if (pathsep_pos == string::npos) {
		return (dotpos == 0 ? path : path.substr(0, dotpos));
	} else if(pathsep_pos >= dotpos +1) {
		return path;
	}
	return path.substr(0, dotpos);
}